

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

bool testing::TestCase::TestPassed(TestInfo *test_info)

{
  bool bVar1;
  TestResult *this;
  undefined1 local_11;
  TestInfo *test_info_local;
  
  bVar1 = TestInfo::should_run(test_info);
  local_11 = false;
  if (bVar1) {
    this = TestInfo::result(test_info);
    local_11 = TestResult::Passed(this);
  }
  return local_11;
}

Assistant:

static bool TestPassed(const TestInfo* test_info) {
    return test_info->should_run() && test_info->result()->Passed();
  }